

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_server_hello(ptls_t *tls,st_ptls_server_hello_t *sh,uint8_t *src,uint8_t *end)

{
  int iVar1;
  uint8_t *puVar2;
  uint16_t local_b2;
  uint8_t *puStack_b0;
  uint16_t group;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  uint8_t found [8];
  uint16_t type;
  ptls_cipher_suite_t **cs;
  undefined1 local_60 [4];
  uint16_t csid;
  uint16_t protver;
  int local_30;
  uint16_t local_2a;
  int ret;
  uint16_t selected_psk_identity;
  uint8_t *end_local;
  uint8_t *src_local;
  st_ptls_server_hello_t *sh_local;
  ptls_t *tls_local;
  
  local_2a = 0xffff;
  _ret = end;
  end_local = src;
  src_local = sh->random;
  sh_local = (st_ptls_server_hello_t *)tls;
  memset(local_60,0,0x30);
  memcpy(sh,local_60,0x30);
  local_30 = decode16((uint16_t *)((long)&cs + 6),&end_local,_ret);
  if (local_30 == 0) {
    if (cs._6_2_ == 0x7f12) {
      if ((long)_ret - (long)end_local < 0x20) {
        local_30 = 0x32;
      }
      else {
        end_local = end_local + 0x20;
        local_30 = decode16((uint16_t *)((long)&cs + 4),&end_local,_ret);
        if (local_30 == 0) {
          for (unique0x00012000 = *(long **)(*(long *)sh_local->random + 0x10);
              (*stack0xffffffffffffff90 != 0 && (*(short *)*stack0xffffffffffffff90 != cs._4_2_));
              register0x00000000 = stack0xffffffffffffff90 + 1) {
          }
          if (*stack0xffffffffffffff90 == 0) {
            local_30 = 0x28;
          }
          else {
            *(long *)sh_local[5].random = *stack0xffffffffffffff90;
            memset((void *)((long)&_capacity + 6),0,8);
            _block_size = 2;
            if ((ulong)((long)_ret - (long)end_local) < 2) {
              local_30 = 0x32;
            }
            else {
              end_1 = (uint8_t *)0x0;
              do {
                puVar2 = end_local + 1;
                end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end_local);
                _block_size = _block_size - 1;
                end_local = puVar2;
              } while (_block_size != 0);
              if (_ret + -(long)puVar2 < end_1) {
                local_30 = 0x32;
              }
              else {
                _capacity_1 = (size_t)(puVar2 + (long)end_1);
                _block_size = 0;
                do {
                  if (end_local == (uint8_t *)_capacity_1) {
                    if (end_local != (uint8_t *)_capacity_1) {
                      return 0x32;
                    }
                    if (end_local != _ret) {
                      return 0x32;
                    }
                    if (local_2a != 0xffff) {
                      if (-1 < (char)((char)sh_local[5].peerkey.len << 7)) {
                        return 0x2f;
                      }
                      if (local_2a != 0) {
                        return 0x2f;
                      }
                      *(byte *)&sh_local[5].peerkey.len = (byte)sh_local[5].peerkey.len & 0xfb | 4;
                    }
                    if ((*(long *)(src_local + 0x20) == 0) &&
                       (-1 < (char)((char)sh_local[5].peerkey.len << 5))) {
                      return 0x2f;
                    }
                    return 0;
                  }
                  local_30 = decode16((uint16_t *)found,&end_local,(uint8_t *)_capacity_1);
                  if (local_30 != 0) {
                    return local_30;
                  }
                  if ((ushort)found._0_2_ < 8) {
                    if (((uint)*(byte *)((long)&_capacity + (long)(int)((ushort)found._0_2_ / 8) + 6
                                        ) & 1 << (sbyte)((ulong)(ushort)found._0_2_ % 8)) != 0) {
                      return 0x2f;
                    }
                    *(byte *)((long)&_capacity + (long)(int)((ushort)found._0_2_ / 8) + 6) =
                         *(byte *)((long)&_capacity + (long)(int)((ushort)found._0_2_ / 8) + 6) |
                         (byte)(1 << ((byte)found._0_2_ & 0x1f)) & 7;
                  }
                  _block_size_1 = 2;
                  if (_capacity_1 - (long)end_local < 2) {
                    return 0x32;
                  }
                  end_2 = (uint8_t *)0x0;
                  do {
                    puStack_b0 = end_local + 1;
                    end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end_local);
                    _block_size_1 = _block_size_1 - 1;
                    end_local = puStack_b0;
                  } while (_block_size_1 != 0);
                  if ((uint8_t *)(_capacity_1 - (long)puStack_b0) < end_2) {
                    return 0x32;
                  }
                  puStack_b0 = puStack_b0 + (long)end_2;
                  if (found._0_2_ == 0x28) {
                    iVar1 = decode_key_share_entry
                                      (&local_b2,(ptls_iovec_t *)(src_local + 0x20),&end_local,
                                       puStack_b0);
                    if (iVar1 != 0) {
                      return iVar1;
                    }
                    if (end_local != puStack_b0) {
                      return 0x32;
                    }
                    if (**(uint16_t **)(sh_local[5].random + 8) != local_b2) {
                      return 0x2f;
                    }
                    local_30 = 0;
                  }
                  else if (found._0_2_ == 0x29) {
                    iVar1 = decode16(&local_2a,&end_local,puStack_b0);
                    if (iVar1 != 0) {
                      return iVar1;
                    }
                    local_30 = 0;
                  }
                  else {
                    end_local = puStack_b0;
                    if (found._0_2_ == 0x2b) {
                      return 0x32;
                    }
                  }
                } while (end_local == puStack_b0);
                local_30 = 0x32;
              }
            }
          }
        }
      }
    }
    else {
      local_30 = 0x28;
    }
  }
  return local_30;
}

Assistant:

static int decode_server_hello(ptls_t *tls, struct st_ptls_server_hello_t *sh, const uint8_t *src, const uint8_t *end)
{
    uint16_t selected_psk_identity = UINT16_MAX;
    int ret;

    *sh = (struct st_ptls_server_hello_t){};

    { /* check protocol version */
        uint16_t protver;
        if ((ret = decode16(&protver, &src, end)) != 0)
            goto Exit;
        if (protver != PTLS_PROTOCOL_VERSION_DRAFT18) {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
            goto Exit;
        }
    }

    /* skip random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src += PTLS_HELLO_RANDOM_SIZE;

    { /* select cipher_suite */
        uint16_t csid;
        ptls_cipher_suite_t **cs;
        if ((ret = decode16(&csid, &src, end)) != 0)
            goto Exit;
        for (cs = tls->ctx->cipher_suites; *cs != NULL; ++cs)
            if ((*cs)->id == csid)
                break;
        if (*cs == NULL) {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
            goto Exit;
        }
        tls->cipher_suite = *cs;
    }

    uint16_t type;
    decode_extensions(src, end, &type, {
        switch (type) {
        case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        case PTLS_EXTENSION_TYPE_KEY_SHARE: {
            uint16_t group;
            if ((ret = decode_key_share_entry(&group, &sh->peerkey, &src, end)) != 0)
                goto Exit;
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            if (tls->client.key_exchange.algo->id != group) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        } break;
        case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY:
            if ((ret = decode16(&selected_psk_identity, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    if (selected_psk_identity != UINT16_MAX) {
        if (!tls->client.offered_psk) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        if (selected_psk_identity != 0) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        tls->client.is_psk = 1;
    }
    if (sh->peerkey.base == NULL && !tls->client.is_psk) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}